

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall FHealthBar::MakeTexture(FHealthBar *this)

{
  uint max;
  ulong uVar1;
  BYTE light;
  int max_00;
  long lVar2;
  ulong uVar3;
  BYTE dark;
  
  max = this->VialLevel;
  if (max == 999) {
    light = this->Colors[4];
    dark = this->Colors[5];
    max_00 = 0;
  }
  else if ((int)max < 0x65) {
    uVar1 = (ulong)(max < 0x15) * 4;
    lVar2 = 0x22e;
    if (10 < (int)max) {
      lVar2 = uVar1 + 0x228;
    }
    uVar3 = 0x22f;
    if (10 < (int)max) {
      uVar3 = uVar1 | 0x229;
    }
    FillBar(this,0,max,*(BYTE *)((long)(this->super_FTexture).gl_info.Material + lVar2 + -0x48),
            *(BYTE *)((long)(this->super_FTexture).gl_info.Material + (uVar3 - 0x48)));
    max_00 = this->VialLevel;
    light = '\0';
    dark = '\0';
  }
  else {
    max_00 = 200 - max;
    FillBar(this,0,max_00,this->Colors[0],this->Colors[1]);
    light = this->Colors[2];
    dark = this->Colors[3];
  }
  FillBar(this,max_00,100,light,dark);
  return;
}

Assistant:

void FHealthBar::MakeTexture ()
{
	if (VialLevel == 999)
	{
		FillBar (0, 100, Colors[4], Colors[5]);
	}
	else
	{
		if (VialLevel <= 100)
		{
			if (VialLevel <= 10)
			{
				FillBar (0, VialLevel, Colors[6], Colors[7]);
			}
			else if (VialLevel <= 20)
			{
				FillBar (0, VialLevel, Colors[4], Colors[5]);
			}
			else
			{
				FillBar (0, VialLevel, Colors[0], Colors[1]);
			}
			FillBar (VialLevel, 100, 0, 0);
		}
		else
		{
			int stop = 100 - (VialLevel - 100);
			FillBar (0, stop, Colors[0], Colors[1]);
			FillBar (stop, 100, Colors[2], Colors[3]);
		}
	}
}